

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *window,int n)

{
  ImGuiID IVar1;
  uint uVar2;
  long lVar3;
  int local_c;
  
  local_c = n;
  if ((uint)n < 4) {
    if ((window->field_0x3e1 & 1) != 0) {
      window = window->DockNode->HostWindow;
    }
    lVar3 = 0;
    IVar1 = ImHashStr("#RESIZE",0,window->ID);
    uVar2 = ~IVar1;
    do {
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar3) ^ uVar2 & 0xff]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    return ~uVar2;
  }
  __assert_fail("n >= 0 && n < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x1642,"ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *, int)");
}

Assistant:

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n < 4);
    ImGuiID id = window->DockIsActive ? window->DockNode->HostWindow->ID : window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}